

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

word If_CluDeriveDisjoint(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint nVars_00;
  word pCofs [3] [256];
  
  nVars_00 = nVars - g->nVars;
  If_CluCountCofs(pF,nVars,(int)g->nVars,0,pCofs);
  bVar2 = (byte)nVars_00;
  if ((int)nVars_00 < 6) {
    *pF = pCofs[1][0] << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) | pCofs[0][0];
  }
  else {
    If_CluCopy(pF,pCofs[0],nVars_00);
    If_CluCopy(pF + (1 << (bVar2 - 6 & 0x1f)),pCofs[1],nVars_00);
  }
  if (r != (If_Grp_t *)0x0) {
    r->nVars = bVar2 + 1;
    r->nMyu = '\0';
    uVar1 = 0;
    uVar3 = 0;
    if (0 < (int)nVars_00) {
      uVar3 = (ulong)nVars_00;
    }
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      r->pVars[uVar1] = (char)P2V[uVar1];
    }
    r->pVars[(int)nVars_00] = (char)nVars;
  }
  return pCofs[2][0];
}

Assistant:

word If_CluDeriveDisjoint( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r )
{
    word pCofs[3][CLU_WRD_MAX/4];
    int i, RetValue, nFSset = nVars - g->nVars;
    RetValue = If_CluCountCofs( pF, nVars, g->nVars, 0, pCofs );
//    assert( RetValue == 2 );

    if ( nFSset < 6 )
        pF[0] = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    else
    {
        If_CluCopy( pF, pCofs[0], nFSset );
        If_CluCopy( pF + If_CluWordNum(nFSset), pCofs[1], nFSset );
    }
    // create the resulting group
    if ( r )
    {
        r->nVars = nFSset + 1;
        r->nMyu = 0;
        for ( i = 0; i < nFSset; i++ )
            r->pVars[i] = P2V[i];
        r->pVars[nFSset] = nVars;
    }
    return pCofs[2][0];
}